

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall Scene::addLight(Scene *this,Light *light)

{
  bool bVar1;
  reference ppLVar2;
  Light *l;
  iterator __end1;
  iterator __begin1;
  vector<Light_*,_std::allocator<Light_*>_> *__range1;
  Light *light_local;
  Scene *this_local;
  
  __range1 = (vector<Light_*,_std::allocator<Light_*>_> *)light;
  light_local = (Light *)this;
  __end1 = std::vector<Light_*,_std::allocator<Light_*>_>::begin(&this->lights);
  l = (Light *)std::vector<Light_*,_std::allocator<Light_*>_>::end(&this->lights);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Light_**,_std::vector<Light_*,_std::allocator<Light_*>_>_>
                                *)&l);
    if (!bVar1) {
      std::vector<Light_*,_std::allocator<Light_*>_>::push_back
                (&this->lights,(value_type *)&__range1);
      return;
    }
    ppLVar2 = __gnu_cxx::
              __normal_iterator<Light_**,_std::vector<Light_*,_std::allocator<Light_*>_>_>::
              operator*(&__end1);
    if (*ppLVar2 == (Light *)__range1) break;
    __gnu_cxx::__normal_iterator<Light_**,_std::vector<Light_*,_std::allocator<Light_*>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void Scene::addLight(Light * light)
{
	for (Light* l : lights)
	{
		if (l == light)
		{
			return;
		}
	}
	lights.push_back(light);
}